

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O1

mu_Rect mu_layout_next(mu_Context *ctx)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  mu_Style *pmVar4;
  mu_Vec2 mVar5;
  mu_Vec2 *pmVar6;
  undefined8 uVar7;
  mu_Layout *layout;
  int *piVar8;
  int iVar9;
  undefined8 uVar10;
  int type;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  mu_Rect mVar16;
  
  iVar2 = (ctx->layout_stack).idx;
  piVar8 = (int *)((long)&ctx->id_stack + (long)iVar2 * 0x8c + -4);
  pmVar4 = ctx->style;
  iVar11 = (ctx->layout_stack).items[(long)iVar2 + -1].next_type;
  if (iVar11 == 0) {
    if ((ctx->layout_stack).items[(long)iVar2 + -1].item_index ==
        (ctx->layout_stack).items[(long)iVar2 + -1].items) {
      mVar5.y = (ctx->layout_stack).items[(long)iVar2 + -1].next_row;
      mVar5.x = (ctx->layout_stack).items[(long)iVar2 + -1].indent;
      (ctx->layout_stack).items[(long)iVar2 + -1].position = mVar5;
      (ctx->layout_stack).items[(long)iVar2 + -1].item_index = 0;
    }
    if ((ctx->layout_stack).items[(long)iVar2 + -1].items < 1) {
      pmVar6 = &(ctx->layout_stack).items[(long)iVar2 + -1].size;
    }
    else {
      pmVar6 = (mu_Vec2 *)
               (piVar8 + (long)(ctx->layout_stack).items[(long)iVar2 + -1].item_index + 0xe);
    }
    iVar12 = pmVar6->x;
    iVar13 = (ctx->layout_stack).items[(long)iVar2 + -1].size.y;
    if (iVar12 == 0) {
      iVar12 = pmVar4->padding * 2 + (pmVar4->size).x;
    }
    if (iVar13 == 0) {
      iVar13 = pmVar4->padding * 2 + (pmVar4->size).y;
    }
    iVar14 = (ctx->layout_stack).items[(long)iVar2 + -1].position.x;
    if (iVar12 < 0) {
      iVar12 = (iVar12 - iVar14) + *(int *)((long)&ctx->id_stack + (long)iVar2 * 0x8c + 4) + 1;
    }
    iVar15 = (ctx->layout_stack).items[(long)iVar2 + -1].position.y;
    if (iVar13 < 0) {
      iVar13 = (iVar13 - iVar15) + (ctx->layout_stack).items[(long)iVar2 + -1].body.h + 1;
    }
    piVar1 = &(ctx->layout_stack).items[(long)iVar2 + -1].item_index;
    *piVar1 = *piVar1 + 1;
  }
  else {
    (ctx->layout_stack).items[(long)iVar2 + -1].next_type = 0;
    iVar14 = (ctx->layout_stack).items[(long)iVar2 + -1].next.x;
    iVar15 = (ctx->layout_stack).items[(long)iVar2 + -1].next.y;
    iVar12 = (ctx->layout_stack).items[(long)iVar2 + -1].next.w;
    iVar13 = (ctx->layout_stack).items[(long)iVar2 + -1].next.h;
    if (iVar11 == 2) {
      (ctx->last_rect).x = iVar14;
      (ctx->last_rect).y = iVar15;
      (ctx->last_rect).w = iVar12;
      (ctx->last_rect).h = iVar13;
      uVar7._0_4_ = (ctx->last_rect).x;
      uVar7._4_4_ = (ctx->last_rect).y;
      uVar10._0_4_ = (ctx->last_rect).w;
      uVar10._4_4_ = (ctx->last_rect).h;
      goto LAB_00147db3;
    }
  }
  iVar11 = pmVar4->spacing;
  pmVar6 = &(ctx->layout_stack).items[(long)iVar2 + -1].position;
  pmVar6->x = pmVar6->x + iVar11 + iVar12;
  iVar9 = (ctx->layout_stack).items[(long)iVar2 + -1].next_row;
  iVar11 = iVar15 + iVar13 + iVar11;
  if (iVar11 < iVar9) {
    iVar11 = iVar9;
  }
  (ctx->layout_stack).items[(long)iVar2 + -1].next_row = iVar11;
  iVar14 = iVar14 + *piVar8;
  iVar15 = iVar15 + *(int *)((long)&ctx->id_stack + (long)iVar2 * 0x8c);
  iVar11 = iVar14 + iVar12;
  iVar9 = (ctx->layout_stack).items[(long)iVar2 + -1].max.x;
  iVar3 = (ctx->layout_stack).items[(long)iVar2 + -1].max.y;
  if (iVar11 < iVar9) {
    iVar11 = iVar9;
  }
  iVar9 = iVar15 + iVar13;
  if (iVar9 < iVar3) {
    iVar9 = iVar3;
  }
  (ctx->layout_stack).items[(long)iVar2 + -1].max.x = iVar11;
  (ctx->layout_stack).items[(long)iVar2 + -1].max.y = iVar9;
  (ctx->last_rect).x = iVar14;
  (ctx->last_rect).y = iVar15;
  (ctx->last_rect).w = iVar12;
  (ctx->last_rect).h = iVar13;
  uVar7._0_4_ = (ctx->last_rect).x;
  uVar7._4_4_ = (ctx->last_rect).y;
  uVar10._0_4_ = (ctx->last_rect).w;
  uVar10._4_4_ = (ctx->last_rect).h;
LAB_00147db3:
  mVar16.w = (int)uVar10;
  mVar16.h = (int)((ulong)uVar10 >> 0x20);
  mVar16.x = (int)uVar7;
  mVar16.y = (int)((ulong)uVar7 >> 0x20);
  return mVar16;
}

Assistant:

mu_Rect mu_layout_next(mu_Context *ctx) {
  mu_Layout *layout = get_layout(ctx);
  mu_Style *style = ctx->style;
  mu_Rect res;

  if (layout->next_type) {
    /* handle rect set by `mu_layout_set_next` */
    int type = layout->next_type;
    layout->next_type = 0;
    res = layout->next;
    if (type == ABSOLUTE) { return (ctx->last_rect = res); }

  } else {
    /* handle next row */
    if (layout->item_index == layout->items) {
      mu_layout_row(ctx, layout->items, NULL, layout->size.y);
    }

    /* position */
    res.x = layout->position.x;
    res.y = layout->position.y;

    /* size */
    res.w = layout->items > 0 ? layout->widths[layout->item_index] : layout->size.x;
    res.h = layout->size.y;
    if (res.w == 0) { res.w = style->size.x + style->padding * 2; }
    if (res.h == 0) { res.h = style->size.y + style->padding * 2; }
    if (res.w <  0) { res.w += layout->body.w - res.x + 1; }
    if (res.h <  0) { res.h += layout->body.h - res.y + 1; }

    layout->item_index++;
  }

  /* update position */
  layout->position.x += res.w + style->spacing;
  layout->next_row = mu_max(layout->next_row, res.y + res.h + style->spacing);

  /* apply body offset */
  res.x += layout->body.x;
  res.y += layout->body.y;

  /* update max position */
  layout->max.x = mu_max(layout->max.x, res.x + res.w);
  layout->max.y = mu_max(layout->max.y, res.y + res.h);

  return (ctx->last_rect = res);
}